

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O3

void soul::HTMLGenerator::addMarkdownAsHTML
               (HTMLElement *parent,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines)

{
  byte bVar1;
  pointer pcVar2;
  pointer pHVar3;
  int iVar4;
  HTMLElement *pHVar5;
  size_type *psVar6;
  long lVar7;
  uint uVar8;
  iterator iVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  HTMLElement *pHVar12;
  undefined8 uVar13;
  undefined1 *puVar14;
  undefined8 uVar15;
  pointer pbVar16;
  pointer pbVar17;
  string_view value;
  string_view text;
  string_view value_00;
  string_view text_00;
  string_view value_01;
  string_view markdown;
  string_view markdown_00;
  string type;
  string trimmed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paragraphs;
  string local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  ulong local_208;
  undefined8 uStack_200;
  ListLevel *local_1f8;
  iterator iStack_1f0;
  ListLevel *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  HTMLElement *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  size_t local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  bool local_150;
  undefined7 uStack_14f;
  undefined8 uStack_148;
  string local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  code *local_d0;
  code *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  pointer local_80;
  string local_78;
  CodeLocation local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  groupMarkdownIntoParagraphs(&local_48,lines);
  local_1f8 = (ListLevel *)0x0;
  iStack_1f0._M_current = (ListLevel *)0x0;
  local_1e8 = (ListLevel *)0x0;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_80 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pbVar16 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar17 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar2 = (pbVar17->_M_dataplus)._M_p;
      local_160._M_allocated_capacity = (size_type)&local_150;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar2,pcVar2 + pbVar17->_M_string_length);
      pHVar12 = (HTMLElement *)local_160._8_8_;
      local_218._M_allocated_capacity = (size_type)&local_208;
      if ((HTMLElement *)local_160._8_8_ == (HTMLElement *)0x0) {
LAB_0024711d:
        local_218._8_8_ = (HTMLElement *)0x0;
        local_208 = local_208 & 0xffffffffffffff00;
LAB_00247130:
        if ((bool *)local_160._M_allocated_capacity != &local_150) {
          operator_delete((void *)local_160._M_allocated_capacity,CONCAT71(uStack_14f,local_150) + 1
                         );
        }
      }
      else {
        if ((*(bool *)local_160._M_allocated_capacity - 9 < 5) ||
           (*(bool *)local_160._M_allocated_capacity == true)) {
          if ((HTMLElement *)local_160._8_8_ != (HTMLElement *)0x1) {
            puVar14 = (undefined1 *)(local_160._8_8_ - 1);
            uVar13 = local_160._M_allocated_capacity;
            do {
              uVar13 = uVar13 + 1;
              if ((4 < *(bool *)uVar13 - 9) && (*(bool *)uVar13 != true)) {
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          ((string *)&local_218,uVar13,
                           (bool *)(local_160._M_allocated_capacity + local_160._8_8_));
                goto LAB_00247130;
              }
              puVar14 = puVar14 + -1;
            } while (puVar14 != (undefined1 *)0x0);
          }
          goto LAB_0024711d;
        }
        if ((bool *)local_160._M_allocated_capacity == &local_150) {
          uStack_200 = uStack_148;
        }
        else {
          local_218._M_allocated_capacity = local_160._M_allocated_capacity;
        }
        local_208 = CONCAT71(uStack_14f,local_150);
        local_160._8_8_ = (HTMLElement *)0x0;
        local_150 = false;
        local_218._8_8_ = pHVar12;
        local_160._M_allocated_capacity = (size_type)&local_150;
      }
      uVar11 = pbVar17->_M_string_length - local_218._8_8_;
      if (((ulong)local_218._8_8_ < (HTMLElement *)0x2) ||
         (((*(bool *)local_218._M_allocated_capacity != true &&
           (*(bool *)local_218._M_allocated_capacity != true)) ||
          (*(bool *)(local_218._M_allocated_capacity + 1) != true)))) {
        if (iStack_1f0._M_current != local_1f8) {
          iStack_1f0._M_current = local_1f8;
        }
        if (((ulong)local_218._8_8_ < (HTMLElement *)0x3) ||
           (*(bool *)(local_218._M_allocated_capacity + 2) != true ||
            *(short *)local_218._M_allocated_capacity != 0x6060)) {
          if (uVar11 < 4) {
            if ((HTMLElement *)local_218._8_8_ != (HTMLElement *)0x0) {
              pHVar12 = parent;
              if (local_1f8 != iStack_1f0._M_current) {
                pHVar12 = iStack_1f0._M_current[-1].ul;
              }
              iVar9._M_current = iStack_1f0._M_current;
              pHVar12 = choc::html::HTMLElement::addParagraph(pHVar12);
              markdown._M_str = (char *)iVar9._M_current;
              markdown._M_len = local_218._M_allocated_capacity;
              appendSpansForContent
                        ((HTMLGenerator *)pHVar12,(HTMLElement *)local_218._8_8_,markdown);
            }
          }
          else {
            pHVar12 = parent;
            if (local_1f8 != iStack_1f0._M_current) {
              pHVar12 = iStack_1f0._M_current[-1].ul;
            }
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"code","");
            std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
            emplace_back<std::__cxx11::string>
                      ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                       &pHVar12->children,&local_180);
            value._M_str = "unspecified_code";
            value._M_len = 0x10;
            pHVar5 = choc::html::HTMLElement::setClass
                               ((pHVar12->children).
                                super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1,value);
            pHVar5->contentIsInline = true;
            local_1e0 = &local_1d0;
            pcVar2 = (pbVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e0,pcVar2,pcVar2 + pbVar17->_M_string_length);
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            for (pHVar12 = local_1d8; pHVar12 != (HTMLElement *)0x0;
                pHVar12 = (HTMLElement *)
                          ((long)&pHVar12[-1].children.
                                  super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
              if ((4 < ((byte *)((long)local_1e0 + -1))[(long)pHVar12] - 9) &&
                 (((byte *)((long)local_1e0 + -1))[(long)pHVar12] != 0x20)) {
                *(byte *)((long)&(pHVar12->name)._M_dataplus._M_p + (long)local_1e0->_M_local_buf) =
                     0;
                paVar10 = &local_1d0;
                if (local_1e0 == paVar10) {
                  local_238.field_2._8_8_ = local_1d0._8_8_;
                  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_238._M_dataplus._M_p;
                }
                local_238.field_2._M_allocated_capacity = local_1d0._M_allocated_capacity;
                psVar6 = (size_type *)&local_1d8;
                local_238._M_dataplus._M_p = (pointer)local_1e0;
                local_238._M_string_length = (size_type)pHVar12;
                local_1e0 = paVar10;
                local_1d8 = pHVar12;
                goto LAB_002473a0;
              }
            }
            psVar6 = &local_238._M_string_length;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p;
LAB_002473a0:
            *psVar6 = 0;
            paVar10->_M_local_buf[0] = 0;
            text._M_str = local_238._M_dataplus._M_p;
            text._M_len = local_238._M_string_length;
            choc::html::HTMLElement::addContent(pHVar5,text);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1e0 != &local_1d0) {
              operator_delete(local_1e0,local_1d0._M_allocated_capacity + 1);
            }
            uVar13 = local_180.field_2._M_allocated_capacity;
            uVar15 = local_180._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) goto LAB_002479ba;
          }
        }
        else {
          lVar7 = std::__cxx11::string::find((char)&local_218,10);
          if (lVar7 != -1) {
            std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_218);
            choc::text::trim(&local_238,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::substr((ulong)&local_1c0,(ulong)&local_218);
            pHVar12 = parent;
            if (local_1f8 != iStack_1f0._M_current) {
              pHVar12 = iStack_1f0._M_current[-1].ul;
            }
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"code","");
            std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
            emplace_back<std::__cxx11::string>
                      ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                       &pHVar12->children,&local_c0);
            pHVar3 = (pHVar12->children).
                     super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pHVar3[-1].contentIsInline = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            pHVar12 = pHVar3 + -1;
            iVar4 = std::__cxx11::string::compare((char *)&local_238);
            if (iVar4 == 0) {
              value_01._M_str = "hljs";
              value_01._M_len = 4;
              choc::html::HTMLElement::setClass(pHVar12,value_01);
              local_120._M_allocated_capacity = (size_type)&local_110;
              local_120._8_8_ = 0;
              local_110._M_local_buf[0] = '\0';
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              if (local_1c0 == &local_1b0) {
                local_140.field_2._8_8_ = local_1b0._8_8_;
              }
              else {
                local_140._M_dataplus._M_p = (pointer)local_1c0;
              }
              local_140.field_2._M_allocated_capacity._1_7_ = local_1b0._M_allocated_capacity._1_7_;
              local_140.field_2._M_local_buf[0] = local_1b0._M_local_buf[0];
              local_140._M_string_length = local_1b8;
              local_1b8 = 0;
              local_1b0._M_local_buf[0] = '\0';
              local_1c0 = &local_1b0;
              CodeLocation::createFromString(&local_58,(string *)&local_120,&local_140);
              local_e0._8_8_ = 0;
              local_c8 = std::
                         _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:802:67)>
                         ::_M_invoke;
              local_d0 = std::
                         _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:802:67)>
                         ::_M_manager;
              local_e0._M_allocated_capacity = (size_type)pHVar12;
              SourceCodeUtilities::iterateSyntaxTokens
                        (&local_58,
                         (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)&local_e0);
              if (local_d0 != (code *)0x0) {
                (*local_d0)(&local_e0,&local_e0,3);
              }
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.sourceCode.object);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_allocated_capacity != &local_110) {
                operator_delete((void *)local_120._M_allocated_capacity,
                                CONCAT71(local_110._M_allocated_capacity._1_7_,
                                         local_110._M_local_buf[0]) + 1);
              }
            }
            else {
              value_00._M_str = "unspecified_code";
              value_00._M_len = 0x10;
              pHVar12 = choc::html::HTMLElement::setClass(pHVar12,value_00);
              text_00._M_str = (char *)local_1c0;
              text_00._M_len = local_1b8;
              choc::html::HTMLElement::addContent(pHVar12,text_00);
            }
            if (local_1c0 != &local_1b0) {
              operator_delete(local_1c0,
                              CONCAT71(local_1b0._M_allocated_capacity._1_7_,
                                       local_1b0._M_local_buf[0]) + 1);
            }
            uVar13 = local_238.field_2._M_allocated_capacity;
            uVar15 = local_238._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p == &local_238.field_2) goto LAB_002479c2;
            goto LAB_002479ba;
          }
        }
      }
      else {
        pHVar12 = (HTMLElement *)(uVar11 + 1);
        iVar9._M_current = iStack_1f0._M_current;
        do {
          iStack_1f0._M_current = iVar9._M_current;
          pHVar5 = parent;
          if (local_1f8 == iStack_1f0._M_current) goto LAB_002471c0;
          iVar9._M_current = iStack_1f0._M_current + -1;
        } while (pHVar12 < (HTMLElement *)iStack_1f0._M_current[-1].indent);
        if ((HTMLElement *)iStack_1f0._M_current[-1].indent < pHVar12) {
          pHVar5 = iStack_1f0._M_current[-1].ul;
LAB_002471c0:
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ul","");
          std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
          emplace_back<std::__cxx11::string>
                    ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                     &pHVar5->children,&local_a0);
          pbVar16 = local_80;
          local_238._M_dataplus._M_p =
               (pointer)((pHVar5->children).
                         super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
          local_238._M_string_length = (size_type)pHVar12;
          if (iStack_1f0._M_current == local_1e8) {
            std::
            vector<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel,std::allocator<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>>
            ::
            _M_realloc_insert<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>
                      ((vector<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel,std::allocator<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>>
                        *)&local_1f8,iStack_1f0,(ListLevel *)&local_238);
          }
          else {
            (iStack_1f0._M_current)->ul = (HTMLElement *)local_238._M_dataplus._M_p;
            (iStack_1f0._M_current)->indent = (size_t)pHVar12;
            iStack_1f0._M_current = iStack_1f0._M_current + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
        pHVar12 = iStack_1f0._M_current[-1].ul;
        local_100._M_allocated_capacity = (size_type)&local_f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"li","");
        std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
        emplace_back<std::__cxx11::string>
                  ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
                   &pHVar12->children,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
        pHVar3 = *(pointer *)
                  ((long)&(pHVar12->children).
                          super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                          ._M_impl.super__Vector_impl_data + 8);
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0xffffffffffffffff;
        std::__cxx11::string::substr((ulong)&local_1a0,(ulong)&local_218);
        pHVar12 = (HTMLElement *)local_1a0._8_8_;
        if ((HTMLElement *)local_1a0._8_8_ == (HTMLElement *)0x0) {
LAB_002476c8:
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          local_238._M_string_length = 0;
          local_238.field_2._M_allocated_capacity =
               local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          uVar8 = *(byte *)local_1a0._M_allocated_capacity - 9;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)uVar8;
          if ((uVar8 < 5) || (*(byte *)local_1a0._M_allocated_capacity == 0x20)) {
            if ((HTMLElement *)local_1a0._8_8_ != (HTMLElement *)0x1) {
              puVar14 = (undefined1 *)(local_1a0._8_8_ + -1);
              uVar13 = local_1a0._M_allocated_capacity;
              do {
                uVar13 = uVar13 + 1;
                bVar1 = *(byte *)uVar13;
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(ulong)bVar1;
                if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
                  paVar10 = &local_238.field_2;
                  local_238._M_dataplus._M_p = (pointer)paVar10;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            ((string *)&local_238,uVar13,
                             (byte *)(local_1a0._M_allocated_capacity + local_1a0._8_8_));
                  goto LAB_002476e1;
                }
                puVar14 = puVar14 + -1;
              } while (puVar14 != (undefined1 *)0x0);
            }
            goto LAB_002476c8;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_allocated_capacity == &local_190) {
            local_238.field_2._8_8_ = local_190._8_8_;
            local_1a0._M_allocated_capacity = (size_type)&local_238.field_2;
          }
          local_238.field_2._M_allocated_capacity._1_7_ = local_190._M_allocated_capacity._1_7_;
          local_238.field_2._M_local_buf[0] = local_190._M_local_buf[0];
          local_1a0._8_8_ = (HTMLElement *)0x0;
          local_190._M_local_buf[0] = '\0';
          local_238._M_dataplus._M_p = (pointer)local_1a0._M_allocated_capacity;
          local_238._M_string_length = (size_type)pHVar12;
          local_1a0._M_allocated_capacity = (size_type)&local_190;
        }
LAB_002476e1:
        markdown_00._M_str = (char *)paVar10;
        markdown_00._M_len = (size_t)local_238._M_dataplus._M_p;
        appendSpansForContent
                  ((HTMLGenerator *)(pHVar3 + -1),(HTMLElement *)local_238._M_string_length,
                   markdown_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_allocated_capacity != &local_190) {
          operator_delete((void *)local_1a0._M_allocated_capacity,
                          CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0])
                          + 1);
        }
        uVar13 = local_f0._M_allocated_capacity;
        uVar15 = local_100._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_allocated_capacity != &local_f0) {
LAB_002479ba:
          operator_delete((void *)uVar15,uVar13 + 1);
        }
      }
LAB_002479c2:
      if ((ulong *)local_218._M_allocated_capacity != &local_208) {
        operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar16);
    if (local_1f8 != (ListLevel *)0x0) {
      operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

static void addMarkdownAsHTML (choc::html::HTMLElement& parent, const std::vector<std::string>& lines)
    {
        auto paragraphs = groupMarkdownIntoParagraphs (lines);

        struct ListLevel
        {
            choc::html::HTMLElement& ul;
            size_t indent;
        };

        std::vector<ListLevel> listStack;

        auto getParent = [&] () -> choc::html::HTMLElement& { return listStack.empty() ? parent : listStack.back().ul; };

        for (auto& paragraph : paragraphs)
        {
            auto trimmed = choc::text::trimStart (paragraph);
            auto leadingSpaces = paragraph.length() - trimmed.length();

            if (isListMarker (trimmed))
            {
                auto indent = 1 + leadingSpaces;

                while (! listStack.empty() && listStack.back().indent > indent)
                    listStack.pop_back();

                if (listStack.empty() || listStack.back().indent < indent)
                    listStack.push_back ({ getParent().addChild ("ul"), indent });

                appendSpansForContent (listStack.back().ul.addChild ("li"),
                                       choc::text::trimStart (trimmed.substr (2)));
                continue;
            }

            listStack.clear();

            if (choc::text::startsWith (trimmed, "```"))
            {
                auto endOfLine1 = trimmed.find ('\n');

                if (endOfLine1 != std::string::npos)
                {
                    auto type = choc::text::trim (trimmed.substr (3, endOfLine1 - 3));

                    if (endOfLine1 < trimmed.length() - 1)
                        ++endOfLine1;

                    auto content = trimmed.substr (endOfLine1);
                    auto& code = getParent().addChild ("code").setInline (true);

                    if (type == "soul")
                    {
                        code.setClass ("hljs");

                        SourceCodeUtilities::iterateSyntaxTokens (CodeLocation::createFromString ({}, std::move (content)),
                                                                  [&] (std::string_view token, std::string_view cssClass) -> bool
                        {
                            if (cssClass.empty())
                                code.addContent (token);
                            else
                                code.addSpan (cssClass).addContent (token);

                            return true;
                        });
                    }
                    else
                    {
                        code.setClass ("unspecified_code").addContent (content);
                    }
                }

                continue;
            }

            if (leadingSpaces >= 4)
            {
                getParent().addChild ("code").setClass ("unspecified_code").setInline (true)
                    .addContent (choc::text::trimEnd (paragraph));

                continue;
            }

            if (! trimmed.empty())
                appendSpansForContent (getParent().addParagraph(), trimmed);
        }
    }